

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

char * nlohmann::detail::dtoa_impl::format_buffer
                 (char *buf,int len,int decimal_exponent,int min_exp,int max_exp)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  byte *pbVar7;
  char *pcVar8;
  uint uVar9;
  
  if (-1 < min_exp) {
    __assert_fail("min_exp < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/json/single_include/nlohmann/json.hpp"
                  ,0x39ad,
                  "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
  }
  if (max_exp < 1) {
    __assert_fail("max_exp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/json/single_include/nlohmann/json.hpp"
                  ,0x39ae,
                  "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
  }
  uVar9 = decimal_exponent + len;
  if ((int)uVar9 <= max_exp && -1 < decimal_exponent) {
    memset(buf + len,0x30,(long)(int)uVar9 - (long)len);
    pcVar8 = buf + (int)uVar9;
    pcVar8[0] = '.';
    pcVar8[1] = '0';
    return pcVar8 + 2;
  }
  if (0 < (int)uVar9 && (int)uVar9 <= max_exp) {
    if (decimal_exponent < 0) {
      uVar5 = (ulong)uVar9;
      memmove(buf + uVar5 + 1,buf + uVar5,(uint)len - uVar5);
      buf[uVar5] = '.';
      return buf + (ulong)(uint)len + 1;
    }
    __assert_fail("k > n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/json/single_include/nlohmann/json.hpp"
                  ,0x39c8,
                  "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
  }
  if (min_exp < (int)uVar9 && (int)uVar9 < 1) {
    memmove(buf + (ulong)-uVar9 + 2,buf,(long)len);
    buf[0] = '0';
    buf[1] = '.';
    memset(buf + 2,0x30,(ulong)-uVar9);
    return buf + (ulong)-uVar9 + 2 + len;
  }
  if (len != 1) {
    memmove(buf + 2,buf + 1,(long)len - 1);
    buf[1] = '.';
    buf = buf + len;
  }
  buf[1] = 'e';
  if ((int)uVar9 < -0x3e6) {
    __assert_fail("e > -1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/json/single_include/nlohmann/json.hpp"
                  ,0x3978,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)");
  }
  if (1000 < (int)uVar9) {
    __assert_fail("e < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/json/single_include/nlohmann/json.hpp"
                  ,0x3979,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)");
  }
  uVar1 = uVar9 - 1;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  buf[2] = ((int)uVar9 < 1) * '\x02' + '+';
  if (uVar3 < 10) {
    buf[3] = '0';
  }
  else {
    if (99 < uVar3) {
      uVar9 = (uVar3 & 0xffff) / 100;
      buf[3] = (char)uVar9 + '0';
      iVar4 = uVar3 + uVar9 * -100;
      bVar2 = (byte)((iVar4 * 0x67 & 0xffffU) >> 10);
      buf[4] = bVar2 | 0x30;
      pbVar7 = (byte *)(buf + 5);
      bVar2 = (char)iVar4 + bVar2 * -10;
      lVar6 = 4;
      goto LAB_00176500;
    }
    bVar2 = (byte)((uVar3 & 0xff) / 10);
    buf[3] = bVar2 | 0x30;
    uVar3 = (uint)(byte)((char)uVar3 + bVar2 * -10);
  }
  bVar2 = (byte)uVar3;
  pbVar7 = (byte *)(buf + 4);
  lVar6 = 3;
LAB_00176500:
  *pbVar7 = bVar2 | 0x30;
  return buf + lVar6 + 2;
}

Assistant:

inline char* format_buffer(char* buf, int len, int decimal_exponent,
                           int min_exp, int max_exp)
{
    assert(min_exp < 0);
    assert(max_exp > 0);

    const int k = len;
    const int n = len + decimal_exponent;

    // v = buf * 10^(n-k)
    // k is the length of the buffer (number of decimal digits)
    // n is the position of the decimal point relative to the start of the buffer.

    if (k <= n and n <= max_exp)
    {
        // digits[000]
        // len <= max_exp + 2

        std::memset(buf + k, '0', static_cast<size_t>(n) - static_cast<size_t>(k));
        // Make it look like a floating-point number (#362, #378)
        buf[n + 0] = '.';
        buf[n + 1] = '0';
        return buf + (static_cast<size_t>(n) + 2);
    }

    if (0 < n and n <= max_exp)
    {
        // dig.its
        // len <= max_digits10 + 1

        assert(k > n);

        std::memmove(buf + (static_cast<size_t>(n) + 1), buf + n, static_cast<size_t>(k) - static_cast<size_t>(n));
        buf[n] = '.';
        return buf + (static_cast<size_t>(k) + 1U);
    }

    if (min_exp < n and n <= 0)
    {
        // 0.[000]digits
        // len <= 2 + (-min_exp - 1) + max_digits10

        std::memmove(buf + (2 + static_cast<size_t>(-n)), buf, static_cast<size_t>(k));
        buf[0] = '0';
        buf[1] = '.';
        std::memset(buf + 2, '0', static_cast<size_t>(-n));
        return buf + (2U + static_cast<size_t>(-n) + static_cast<size_t>(k));
    }

    if (k == 1)
    {
        // dE+123
        // len <= 1 + 5

        buf += 1;
    }
    else
    {
        // d.igitsE+123
        // len <= max_digits10 + 1 + 5

        std::memmove(buf + 2, buf + 1, static_cast<size_t>(k) - 1);
        buf[1] = '.';
        buf += 1 + static_cast<size_t>(k);
    }

    *buf++ = 'e';
    return append_exponent(buf, n - 1);
}